

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::python::Generator::ModuleLevelServiceDescriptorName_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,ServiceDescriptor *descriptor)

{
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,*(string **)descriptor);
  UpperString(__return_storage_ptr__);
  std::operator+(&local_40,"_",__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(FileDescriptor **)(descriptor + 0x10) != this->file_) {
    anon_unknown_0::ModuleName(&local_80,*(string **)*(FileDescriptor **)(descriptor + 0x10));
    std::operator+(&local_60,&local_80,".");
    std::operator+(&local_40,&local_60,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

string Generator::ModuleLevelServiceDescriptorName(
    const ServiceDescriptor& descriptor) const {
  string name = descriptor.name();
  UpperString(&name);
  name = "_" + name;
  if (descriptor.file() != file_) {
    name = ModuleName(descriptor.file()->name()) + "." + name;
  }
  return name;
}